

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlFreeNsList(xmlNsPtr cur)

{
  _xmlNs *p_Var1;
  
  if (cur != (xmlNsPtr)0x0) {
    do {
      p_Var1 = cur->next;
      if (cur->href != (xmlChar *)0x0) {
        (*xmlFree)(cur->href);
      }
      if (cur->prefix != (xmlChar *)0x0) {
        (*xmlFree)(cur->prefix);
      }
      (*xmlFree)(cur);
      cur = p_Var1;
    } while (p_Var1 != (_xmlNs *)0x0);
  }
  return;
}

Assistant:

void
xmlFreeNsList(xmlNsPtr cur) {
    xmlNsPtr next;
    if (cur == NULL) {
	return;
    }
    while (cur != NULL) {
        next = cur->next;
        xmlFreeNs(cur);
	cur = next;
    }
}